

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

stb_vorbis *
stb_vorbis_open_file_section
          (FAudioIOStream *file,int close_on_free,int *error,stb_vorbis_alloc *alloc,uint length)

{
  int iVar1;
  int64_t iVar2;
  stb_vorbis *f;
  stb_vorbis p;
  stb_vorbis sStack_748;
  
  vorbis_init(&sStack_748,alloc);
  sStack_748.f = file;
  iVar2 = (*file->seek)(file->data,0,1);
  sStack_748.f_start = (uint32)iVar2;
  sStack_748.close_on_free = close_on_free;
  sStack_748.stream_len = length;
  iVar1 = start_decoder(&sStack_748);
  if (iVar1 != 0) {
    sStack_748.setup_memory_required = sStack_748.setup_memory_required + 0x720;
    if (sStack_748.alloc.alloc_buffer == (char *)0x0) {
      f = (stb_vorbis *)SDL_malloc(0x720);
    }
    else {
      if (sStack_748.temp_offset < sStack_748.setup_offset + 0x720) goto LAB_0011f419;
      f = (stb_vorbis *)(sStack_748.alloc.alloc_buffer + sStack_748.setup_offset);
      sStack_748.setup_offset = sStack_748.setup_offset + 0x720;
    }
    if (f != (stb_vorbis *)0x0) {
      memcpy(f,&sStack_748,0x720);
      vorbis_pump_first_frame(f);
      return f;
    }
  }
LAB_0011f419:
  if (error != (int *)0x0) {
    *error = sStack_748.error;
  }
  vorbis_deinit(&sStack_748);
  return (stb_vorbis *)0x0;
}

Assistant:

stb_vorbis * stb_vorbis_open_file_section(FILE *file, int close_on_free, int *error, const stb_vorbis_alloc *alloc, unsigned int length)
{
   stb_vorbis *f, p;
   vorbis_init(&p, alloc);
   p.f = file;
   p.f_start = (uint32) ftell(file);
   p.stream_len   = length;
   p.close_on_free = close_on_free;
   if (start_decoder(&p)) {
      f = vorbis_alloc(&p);
      if (f) {
         *f = p;
         vorbis_pump_first_frame(f);
         return f;
      }
   }
   if (error) *error = p.error;
   vorbis_deinit(&p);
   return NULL;
}